

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaANCF_3813::ComputeNF
          (ChElementHexaANCF_3813 *this,double U,double V,double W,ChVectorDynamic<> *Qi,
          double *detJ,ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  double *pdVar6;
  double *pdVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  char *__function;
  long lVar14;
  double *pdVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  double dVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 in_register_00001248 [56];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 local_c0 [2] [64];
  
  auVar46._8_56_ = in_register_00001248;
  auVar46._0_8_ = V;
  auVar55._8_8_ = 0x8000000000000000;
  auVar55._0_8_ = 0x8000000000000000;
  dVar12 = 1.0 - U;
  dVar13 = 1.0 - W;
  auVar19 = vsubsd_avx512f(ZEXT816(0x3ff0000000000000),auVar46._0_16_);
  auVar20 = vaddsd_avx512f(auVar46._0_16_,ZEXT816(0x3ff0000000000000));
  auVar44 = vbroadcastsd_avx512vl(auVar20);
  dVar8 = U + 1.0;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = W + 1.0;
  auVar21 = vmovddup_avx512vl(auVar43);
  auVar27._8_8_ = dVar8;
  auVar27._0_8_ = dVar12;
  auVar42._8_8_ = 0x3fc0000000000000;
  auVar42._0_8_ = 0x3fc0000000000000;
  auVar22 = vmulpd_avx512vl(auVar27,auVar42);
  auVar46 = vpermi2pd_avx512f(_DAT_009982c0,ZEXT864((ulong)dVar13),ZEXT1664(auVar21));
  auVar44 = vblendpd_avx(ZEXT1632(auVar22),auVar44,4);
  auVar45 = vpermi2pd_avx512vl(_DAT_00990f40,ZEXT1632(auVar19),auVar44);
  auVar44 = vpermpd_avx2(auVar44,0x24);
  auVar50._0_8_ = auVar44._0_8_ * auVar45._0_8_;
  auVar50._8_8_ = auVar44._8_8_ * auVar45._8_8_;
  auVar50._16_8_ = auVar44._16_8_ * auVar45._16_8_;
  auVar50._24_8_ = auVar44._24_8_ * auVar45._24_8_;
  auVar47 = vinsertf64x4_avx512f(ZEXT3264(auVar50),auVar50,1);
  local_c0[0] = vmulpd_avx512f(auVar47,auVar46);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = (this->m_InertFlexVec).m_data[1];
  auVar23 = vdivsd_avx512f(ZEXT816(0x4000000000000000),auVar22);
  auVar22 = *(undefined1 (*) [16])
             (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
             m_data.array;
  auVar41 = *(undefined1 (*) [16])
             ((this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 3);
  auVar42 = *(undefined1 (*) [16])
             ((this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 6);
  auVar43 = *(undefined1 (*) [16])
             ((this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 9);
  dVar9 = auVar23._0_8_ * 0.125;
  dVar10 = dVar12 * dVar9;
  dVar9 = dVar8 * dVar9;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar9;
  auVar52._0_8_ = -dVar9;
  auVar52._8_8_ = 0x8000000000000000;
  auVar24 = vmulsd_avx512f(auVar21,auVar24);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar10;
  auVar51._0_8_ = -dVar10;
  auVar51._8_8_ = 0x8000000000000000;
  auVar25 = vmulsd_avx512f(auVar21,auVar25);
  auVar26 = vmulsd_avx512f(auVar21,auVar51);
  auVar27 = vmulsd_avx512f(auVar21,auVar52);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = (this->m_InertFlexVec).m_data[2];
  auVar23 = vdivsd_avx512f(ZEXT816(0x4000000000000000),auVar23);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = (this->m_InertFlexVec).m_data[0];
  auVar28 = vdivsd_avx512f(ZEXT816(0x4000000000000000),auVar28);
  auVar28 = vmulsd_avx512f(auVar28,ZEXT816(0x3fc0000000000000));
  dVar11 = auVar23._0_8_ * 0.125;
  dVar1 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
          .array[0xb];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar1;
  auVar23 = vxorpd_avx512vl(auVar28,auVar55);
  auVar29 = vmulsd_avx512f(auVar20,auVar28);
  auVar28 = vmulsd_avx512f(auVar19,auVar28);
  auVar30 = vmulsd_avx512f(auVar20,auVar23);
  auVar23 = vmulsd_avx512f(auVar19,auVar23);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar8 * dVar11;
  auVar31 = vmulsd_avx512f(auVar19,auVar33);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar12 * dVar11;
  auVar19 = vmulsd_avx512f(auVar19,auVar32);
  auVar32 = vmulsd_avx512f(auVar20,auVar32);
  auVar20 = vmulsd_avx512f(auVar20,auVar33);
  auVar33 = vmulsd_avx512f(auVar21,auVar29);
  auVar34 = vmulsd_avx512f(auVar21,auVar28);
  auVar35 = vmulsd_avx512f(auVar21,auVar30);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar13;
  auVar30 = vmulsd_avx512f(auVar36,auVar30);
  auVar29 = vmulsd_avx512f(auVar36,auVar29);
  auVar28 = vmulsd_avx512f(auVar36,auVar28);
  auVar36 = vmulsd_avx512f(auVar36,auVar23);
  auVar21 = vmulsd_avx512f(auVar21,auVar23);
  auVar23 = *(undefined1 (*) [16])
             ((this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 0xc);
  dVar48 = auVar31._0_8_;
  auVar56._8_8_ = dVar48;
  auVar56._0_8_ = dVar48;
  auVar31 = vmovddup_avx512vl(auVar32);
  dVar8 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
          .array[5];
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar8;
  auVar37 = vmovddup_avx512vl(auVar36);
  auVar38 = vmovddup_avx512vl(auVar28);
  auVar39 = vmovddup_avx512vl(auVar21);
  auVar37 = vmulpd_avx512vl(auVar37,auVar22);
  auVar37 = vfmadd231pd_avx512vl(auVar37,auVar41,auVar38);
  auVar38 = vmovddup_avx512vl(auVar29);
  auVar28 = vmulsd_avx512f(auVar28,auVar49);
  auVar37 = vfmadd231pd_avx512vl(auVar37,auVar42,auVar38);
  auVar38 = vmovddup_avx512vl(auVar30);
  auVar30 = vmulsd_avx512f(auVar30,auVar40);
  auVar37 = vfmadd231pd_avx512vl(auVar37,auVar43,auVar38);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar13 * auVar52._0_8_;
  auVar38 = vmovddup_avx512vl(auVar38);
  auVar37 = vfmadd231pd_avx512vl(auVar37,auVar23,auVar39);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar13 * auVar51._0_8_;
  auVar39 = vmovddup_avx512vl(auVar53);
  auVar39 = vmulpd_avx512vl(auVar39,auVar22);
  auVar38 = vfmadd231pd_avx512vl(auVar39,auVar41,auVar38);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar13 * dVar9;
  auVar39 = vmovddup_avx512vl(auVar54);
  auVar38 = vfmadd231pd_avx512vl(auVar38,auVar42,auVar39);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar13 * dVar10;
  auVar39 = vmovddup_avx512vl(auVar39);
  auVar38 = vfmadd231pd_avx512vl(auVar38,auVar43,auVar39);
  auVar39 = vmovddup_avx512vl(auVar26);
  auVar38 = vfmadd231pd_avx512vl(auVar38,auVar23,auVar39);
  auVar39 = vmovddup_avx512vl(auVar19);
  auVar22 = vmulpd_avx512vl(auVar39,auVar22);
  auVar22 = vfnmsub231pd_avx512vl(auVar22,auVar56,auVar41);
  auVar40 = vmovddup_avx512vl(auVar20);
  auVar41 = vfnmadd231pd_avx512vl(auVar22,auVar40,auVar42);
  auVar22 = *(undefined1 (*) [16])
             ((this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 0x15);
  auVar42 = vfnmadd231pd_avx512vl(auVar41,auVar31,auVar43);
  auVar41 = *(undefined1 (*) [16])
             ((this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 0x12);
  auVar43 = vfmadd231pd_avx512vl(auVar42,auVar23,auVar39);
  auVar42 = *(undefined1 (*) [16])
             ((this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 0xf);
  auVar23 = vmovddup_avx512vl(auVar34);
  auVar23 = vfmadd231pd_avx512vl(auVar37,auVar42,auVar23);
  auVar37 = vmovddup_avx512vl(auVar33);
  auVar43 = vfmadd231pd_avx512vl(auVar43,auVar42,auVar56);
  auVar39 = vxorpd_avx512vl(auVar31,auVar55);
  auVar23 = vfmadd231pd_avx512vl(auVar23,auVar41,auVar37);
  auVar37 = vmovddup_avx512vl(auVar35);
  auVar43 = vfmadd231pd_avx512vl(auVar43,auVar41,auVar40);
  dVar9 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
          .array[0xe];
  auVar23 = vfmadd231pd_avx512vl(auVar23,auVar22,auVar37);
  dVar11 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[2];
  auVar43 = vfmadd231pd_avx512vl(auVar43,auVar22,auVar31);
  dVar12 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[0x14];
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar9;
  auVar26 = vmulsd_avx512f(auVar26,auVar58);
  auVar21 = vmulsd_avx512f(auVar21,auVar58);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar11;
  auVar31 = vmulsd_avx512f(auVar36,auVar60);
  auVar36 = vmulsd_avx512f(auVar53,auVar60);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar12;
  auVar33 = vmulsd_avx512f(auVar33,auVar37);
  auVar28 = vaddsd_avx512f(auVar31,auVar28);
  dVar2 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
          .array[8];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar2;
  auVar29 = vmulsd_avx512f(auVar29,auVar31);
  auVar31 = vmulsd_avx512f(auVar54,auVar31);
  auVar29 = vaddsd_avx512f(auVar29,auVar30);
  auVar30 = vmovddup_avx512vl(auVar27);
  auVar42 = vfmadd231pd_avx512vl(auVar38,auVar42,auVar30);
  dVar3 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
          .array[0x17];
  auVar30 = vmovddup_avx512vl(auVar24);
  auVar28 = vaddsd_avx512f(auVar28,auVar29);
  dVar4 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
          .array[0x11];
  auVar41 = vfmadd231pd_avx512vl(auVar42,auVar41,auVar30);
  auVar42 = vmovddup_avx512vl(auVar25);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar3;
  auVar25 = vmulsd_avx512f(auVar25,auVar30);
  auVar29 = vmulsd_avx512f(auVar35,auVar30);
  auVar30 = vfmadd231pd_avx512vl(auVar41,auVar22,auVar42);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar4;
  auVar22 = vmulsd_avx512f(auVar27,auVar35);
  auVar41 = vmulsd_avx512f(auVar34,auVar35);
  auVar42 = vaddsd_avx512f(auVar33,auVar29);
  auVar24 = vmulsd_avx512f(auVar24,auVar37);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar2;
  auVar27 = vmulsd_avx512f(auVar20,auVar34);
  auVar21 = vaddsd_avx512f(auVar21,auVar41);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar48;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar4;
  auVar41 = vmulsd_avx512f(auVar29,auVar41);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = dVar11;
  auVar29 = vmulsd_avx512f(auVar19,auVar61);
  auVar42 = vaddsd_avx512f(auVar21,auVar42);
  auVar28 = vaddsd_avx512f(auVar28,auVar42);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar9;
  auVar42 = vmulsd_avx512f(auVar19,auVar59);
  dVar9 = auVar36._0_8_ + dVar13 * auVar52._0_8_ * dVar8 + auVar31._0_8_ + dVar13 * dVar10 * dVar1 +
          auVar22._0_8_ + auVar26._0_8_ + auVar24._0_8_ + auVar25._0_8_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar12;
  auVar19 = vmulsd_avx512f(auVar20,auVar21);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar3;
  auVar20 = vmulsd_avx512f(auVar32,auVar57);
  auVar22 = vshufpd_avx(auVar23,auVar23,1);
  auVar21 = vshufpd_avx512vl(auVar30,auVar30,1);
  auVar24 = vshufpd_avx512vl(auVar43,auVar43,1);
  auVar25 = vmulsd_avx512f(auVar28,auVar24);
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       (-dVar48 * dVar8 - auVar29._0_8_) + (auVar39._0_8_ * dVar1 - auVar27._0_8_) +
       auVar42._0_8_ + auVar41._0_8_ + auVar19._0_8_ + auVar20._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar9 * auVar24._0_8_;
  auVar41 = vfmsub231sd_fma(auVar19,auVar21,auVar26);
  auVar42 = vfmsub231sd_fma(auVar25,auVar22,auVar26);
  auVar28 = vmulsd_avx512f(auVar28,auVar21);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar9;
  auVar22 = vfmsub231sd_fma(auVar28,auVar22,auVar20);
  auVar42 = vmulsd_avx512f(auVar30,auVar42);
  auVar22 = vmulsd_avx512f(auVar43,auVar22);
  dVar1 = auVar22._0_8_ + (auVar23._0_8_ * auVar41._0_8_ - auVar42._0_8_);
  *detJ = dVar1;
  *detJ = (this->m_InertFlexVec).m_data[0] * (this->m_InertFlexVec).m_data[1] *
          (this->m_InertFlexVec).m_data[2] * 0.125 * dVar1;
  if ((F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 3) {
    __function = 
    "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
    ;
  }
  else {
    lVar5 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    pdVar6 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    pdVar7 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    lVar14 = 0;
    pdVar15 = pdVar7;
    while (lVar14 * 3 <= lVar5 + -3) {
      dVar1 = *(double *)(local_c0[0] + lVar14 * 8);
      uVar16 = 3;
      if (((ulong)pdVar7 & 7) == 0) {
        uVar17 = -((uint)((ulong)(pdVar7 + lVar14 * 3) >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar17 < 3) {
          uVar16 = (ulong)uVar17;
        }
        if (uVar17 != 0) goto LAB_006ca980;
        uVar16 = 0;
LAB_006ca9a2:
        do {
          pdVar15[uVar16] = dVar1 * pdVar6[uVar16];
          uVar16 = uVar16 + 1;
        } while (uVar16 != 3);
      }
      else {
LAB_006ca980:
        uVar18 = 0;
        do {
          pdVar15[uVar18] = dVar1 * pdVar6[uVar18];
          uVar18 = uVar18 + 1;
        } while (uVar16 != uVar18);
        if ((int)uVar16 != 3) goto LAB_006ca9a2;
      }
      lVar14 = lVar14 + 1;
      pdVar15 = pdVar15 + 3;
      if (lVar14 == 8) {
        return;
      }
    }
    __function = 
    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
    ;
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

void ChElementHexaANCF_3813::ComputeNF(
    const double U,              // parametric coordinate in volume
    const double V,              // parametric coordinate in volume
    const double W,              // parametric coordinate in volume
    ChVectorDynamic<>& Qi,       // Return result of N'*F  here, maybe with offset block_offset
    double& detJ,                // Return det[J] here
    const ChVectorDynamic<>& F,  // Input F vector, size is = n.field coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
) {
    // this->ComputeNF(U, V, Qi, detJ, F, state_x, state_w);
    ShapeVector N;
    ShapeVector Nx;
    ShapeVector Ny;
    ShapeVector Nz;
    ShapeFunctions(N, U, V, W);  // evaluate shape functions (in compressed vector)
    ShapeFunctionsDerivativeX(Nx, U, V, W);
    ShapeFunctionsDerivativeY(Ny, U, V, W);
    ShapeFunctionsDerivativeZ(Nz, U, V, W);

    ChMatrixNM<double, 3, 3> rd0;
    rd0.col(0) = m_d0.transpose() * Nx.transpose();
    rd0.col(1) = m_d0.transpose() * Ny.transpose();
    rd0.col(2) = m_d0.transpose() * Nz.transpose();
    detJ = rd0.determinant();
    detJ *= this->GetLengthX() * this->GetLengthY() * this->GetLengthZ() / 8.0;

    for (int i = 0; i < 8; i++) {
        Qi.segment(3 * i, 3) = N(i) * F.segment(0, 3);
    }
}